

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::softmax(tensor *dest,tensor *src)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  tensor *in_RSI;
  long *in_RDI;
  double dVar11;
  long k_3;
  long k_2;
  float temp;
  float *ddd;
  long c;
  long r;
  float *dd_1;
  long n_1;
  long k_1;
  long k;
  float max_val;
  long i;
  float *dd;
  float *ss;
  long n;
  long num;
  float *s;
  float *d;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffce0;
  tensor *in_stack_fffffffffffffce8;
  error_type t;
  tensor *in_stack_fffffffffffffcf0;
  long local_250;
  long local_248;
  float local_23c;
  long local_230;
  long local_228;
  long local_218;
  long local_210;
  long local_208;
  float local_1fc;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  undefined1 local_1b9;
  ostream local_188;
  tensor *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = have_same_dimensions(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  t = (error_type)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  if (!bVar1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    poVar3 = std::operator<<(&local_188,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4cd);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<(&local_188,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<(&local_188,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,"void dlib::cpu::softmax(tensor &, const tensor &)");
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<(&local_188,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"have_same_dimensions(dest,src)");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(&local_188,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"");
    std::operator<<(poVar3,"\n");
    local_1b9 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)in_stack_fffffffffffffcf0,t,in_stack_fffffffffffffce0);
    local_1b9 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  local_1c8 = (**(code **)(*local_8 + 0x18))();
  iVar2 = (*local_10->_vptr_tensor[2])();
  local_1d0 = CONCAT44(extraout_var,iVar2);
  lVar5 = tensor::nr(local_10);
  local_1d8 = tensor::nc(local_10);
  local_1d8 = lVar5 * local_1d8;
  local_1e0 = 0;
  while( true ) {
    lVar5 = local_1e0;
    lVar6 = tensor::num_samples(local_10);
    lVar10 = local_1d0;
    lVar8 = local_1d8;
    if (lVar6 <= lVar5) break;
    lVar7 = tensor::k(local_10);
    lVar6 = local_1c8;
    lVar5 = local_1d8;
    local_1e8 = lVar10 + lVar8 * lVar7 * local_1e0 * 4;
    lVar8 = tensor::k(local_10);
    local_1f0 = lVar6 + lVar5 * lVar8 * local_1e0 * 4;
    for (local_1f8 = 0; local_1f8 < local_1d8; local_1f8 = local_1f8 + 1) {
      local_1fc = std::numeric_limits<float>::infinity();
      local_1fc = -local_1fc;
      local_208 = 0;
      while( true ) {
        lVar5 = tensor::k(local_10);
        if (lVar5 <= local_208) break;
        pfVar9 = std::max<float>(&local_1fc,(float *)(local_1e8 + local_208 * local_1d8 * 4));
        local_1fc = *pfVar9;
        local_208 = local_208 + 1;
      }
      local_210 = 0;
      while( true ) {
        lVar5 = tensor::k(local_10);
        if (lVar5 <= local_210) break;
        dVar11 = std::exp((double)(ulong)(uint)(*(float *)(local_1e8 + local_210 * local_1d8 * 4) -
                                               local_1fc));
        *(int *)(local_1f0 + local_210 * local_1d8 * 4) = SUB84(dVar11,0);
        local_210 = local_210 + 1;
      }
      local_1e8 = local_1e8 + 4;
      local_1f0 = local_1f0 + 4;
    }
    local_1e0 = local_1e0 + 1;
  }
  local_218 = 0;
  while( true ) {
    lVar10 = tensor::num_samples(local_10);
    lVar8 = local_1c8;
    lVar5 = local_1d8;
    if (lVar10 <= local_218) break;
    lVar10 = tensor::k(local_10);
    local_228 = 0;
    while( true ) {
      lVar6 = local_228;
      lVar7 = tensor::nr(local_10);
      if (lVar7 <= lVar6) break;
      local_230 = 0;
      while( true ) {
        lVar6 = local_230;
        lVar7 = tensor::nc(local_10);
        if (lVar7 <= lVar6) break;
        lVar6 = lVar8 + lVar5 * lVar10 * local_218 * 4;
        lVar7 = tensor::nc(local_10);
        lVar6 = lVar6 + local_228 * lVar7 * 4 + local_230 * 4;
        local_23c = 0.0;
        local_248 = 0;
        while( true ) {
          lVar7 = tensor::k(local_10);
          if (lVar7 <= local_248) break;
          local_23c = *(float *)(lVar6 + local_248 * local_1d8 * 4) + local_23c;
          local_248 = local_248 + 1;
        }
        local_250 = 0;
        while( true ) {
          lVar7 = tensor::k(local_10);
          if (lVar7 <= local_250) break;
          *(float *)(lVar6 + local_250 * local_1d8 * 4) =
               *(float *)(lVar6 + local_250 * local_1d8 * 4) / local_23c;
          local_250 = local_250 + 1;
        }
        local_230 = local_230 + 1;
      }
      local_228 = local_228 + 1;
    }
    local_218 = local_218 + 1;
  }
  return;
}

Assistant:

void softmax (
            tensor& dest,
            const tensor& src
        )
        {
            DLIB_CASSERT(have_same_dimensions(dest,src));
            const auto d = dest.host();
            const auto s = src.host();

            const long num = src.nr()*src.nc();
            // Note that we subtract out the max values in each channel before applying
            // exp() to avoid numeric overflow in the subsequent computations.  Doing this
            // doesn't change the resulting output, it just makes it more numerically
            // stable.
            for (long n = 0; n < src.num_samples(); ++n)
            {
                auto ss = s + num*src.k()*n;
                auto dd = d + num*src.k()*n;
                for (long i = 0; i < num; ++i)
                {
                    float max_val = -std::numeric_limits<float>::infinity();
                    for (long k = 0; k < src.k(); ++k)
                        max_val = std::max(max_val, ss[k*num]);

                    for (long k = 0; k < src.k(); ++k)
                        dd[k*num] = std::exp(ss[k*num]-max_val);

                    ++ss;
                    ++dd;
                }
            }

            // Now normalize each channel so they sum to 1.
            for (long n = 0; n < src.num_samples(); ++n)
            {
                const auto dd = d + num*src.k()*n;
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        const auto ddd = dd+r*src.nc()+c;

                        float temp = 0;
                        for (long k = 0; k < src.k(); ++k)
                            temp += ddd[k*num];
                        for (long k = 0; k < src.k(); ++k)
                            ddd[k*num] /= temp;
                    }
                }
            }
        }